

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_as_strings.h
# Opt level: O1

string * join_as_strings<ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>,____C_A_T_C_H____T_E_S_T____141()::__0>&>
                   (string *__return_storage_ptr__,
                   drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>
                   *range,string_view separator)

{
  reference pvVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  bool bVar6;
  string local_50;
  
  pvVar1 = (range->range).t;
  piVar2 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar5 = piVar2;
  do {
    piVar4 = piVar5;
    if (*piVar4 == 5) break;
    piVar5 = piVar4 + 1;
  } while (piVar4 != piVar3);
  if (piVar4 == piVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    do {
      piVar5 = piVar2;
      if (*piVar5 == 5) break;
      piVar2 = piVar5 + 1;
    } while (piVar5 != piVar3);
    ezy::to_string_fn::operator()
              (__return_storage_ptr__,(to_string_fn *)&ezy::cpo::to_string,piVar5);
    pvVar1 = (range->range).t;
    piVar2 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    piVar3 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      piVar5 = piVar3 + 1;
      if (*piVar3 == 5) break;
      bVar6 = piVar3 != piVar2;
      piVar3 = piVar5;
    } while (bVar6);
    if (piVar5 != piVar2) {
      do {
        ezy::to_string_fn::operator()(&local_50,(to_string_fn *)&ezy::cpo::to_string,piVar5);
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)separator._M_str);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        piVar5 = piVar5 + 1;
      } while (piVar5 != piVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
join_as_strings(Range&& range, std::string_view separator = "")
{
  return ezy::join(ezy::transform(std::forward<Range>(range), ezy::to_string), separator);
}